

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

void ncnn::transpose_pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined8 uVar23;
  size_t *psVar24;
  undefined1 (*pauVar25) [64];
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [64];
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  int iVar34;
  undefined1 (*pauVar35) [32];
  undefined1 (*pauVar36) [16];
  long lVar37;
  undefined4 *puVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  
  iVar1 = B->elempack;
  psVar24 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar24 = &B->cstep;
  }
  iVar2 = (int)*psVar24;
  pauVar25 = (undefined1 (*) [64])BT->data;
  lVar27 = 0;
  lVar30 = (long)iVar2;
  lVar39 = (long)j;
  if (0xb < max_jj) {
    lVar27 = (long)(iVar2 * k);
    lVar31 = lVar39 * 0x40 + lVar27 * 4 + 0x2c0;
    lVar26 = lVar39 * 0x20 + lVar27 * 4 + 0x160;
    lVar32 = lVar39 * 0x10 + lVar27 * 4 + 0xb0;
    lVar28 = lVar27 * 4 + lVar39 * 4 + 0x20;
    lVar33 = 0;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar29 = (undefined1 (*) [64])((long)B->data + lVar31);
        iVar34 = 0xf;
        do {
          auVar44 = vunpcklps_avx512f(pauVar29[-0xb],pauVar29[-10]);
          auVar45 = vunpckhps_avx512f(pauVar29[-0xb],pauVar29[-10]);
          auVar46 = vunpcklps_avx512f(pauVar29[-9],pauVar29[-8]);
          auVar47 = vunpckhps_avx512f(pauVar29[-9],pauVar29[-8]);
          auVar48 = vunpcklps_avx512f(pauVar29[-7],pauVar29[-6]);
          auVar49 = vunpckhps_avx512f(pauVar29[-7],pauVar29[-6]);
          auVar50 = vunpcklps_avx512f(pauVar29[-5],pauVar29[-4]);
          auVar51 = vunpckhps_avx512f(pauVar29[-5],pauVar29[-4]);
          auVar52 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar53 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar54 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
          auVar55 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
          auVar56 = vunpcklpd_avx512f(auVar44,auVar46);
          auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
          auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
          auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
          auVar47 = vunpcklpd_avx512f(auVar48,auVar50);
          auVar48 = vunpckhpd_avx512f(auVar48,auVar50);
          auVar50 = vunpcklpd_avx512f(auVar49,auVar51);
          auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
          auVar51 = vunpcklpd_avx512f(auVar52,auVar54);
          auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
          auVar54 = vunpcklpd_avx512f(auVar53,auVar55);
          auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
          auVar55 = vshuff64x2_avx512f(auVar56,auVar47,0x88);
          auVar57 = vshuff64x2_avx512f(auVar51,auVar44,0x88);
          auVar58 = vshuff64x2_avx512f(auVar48,auVar52,0x88);
          auVar59 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
          auVar60 = vshuff64x2_avx512f(auVar54,auVar45,0x88);
          auVar61 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
          auVar47 = vshuff64x2_avx512f(auVar56,auVar47,0xdd);
          auVar44 = vshuff64x2_avx512f(auVar51,auVar44,0xdd);
          auVar48 = vshuff64x2_avx512f(auVar48,auVar52,0xdd);
          auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar54,auVar45,0xdd);
          auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
          auVar50 = vshuff64x2_avx512f(auVar55,auVar57,0x88);
          auVar51 = vshuff64x2_avx512f(auVar58,auVar59,0x88);
          auVar52 = vshuff64x2_avx512f(auVar60,auVar61,0x88);
          auVar53 = vshuff64x2_avx512f(auVar47,auVar44,0x88);
          auVar54 = vshuff64x2_avx512f(auVar48,auVar46,0x88);
          auVar56 = vshuff64x2_avx512f(auVar45,auVar49,0x88);
          auVar55 = vshuff64x2_avx512f(auVar55,auVar57,0xdd);
          auVar57 = vshuff64x2_avx512f(auVar58,auVar59,0xdd);
          auVar58 = vshuff64x2_avx512f(auVar60,auVar61,0xdd);
          auVar44 = vshuff64x2_avx512f(auVar47,auVar44,0xdd);
          auVar46 = vshuff64x2_avx512f(auVar48,auVar46,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar45,auVar49,0xdd);
          *pauVar25 = auVar50;
          pauVar25[1] = auVar51;
          pauVar25[2] = auVar52;
          pauVar25[3] = auVar53;
          pauVar25[4] = auVar54;
          pauVar25[5] = auVar56;
          pauVar25[6] = auVar55;
          pauVar25[7] = auVar57;
          pauVar25[8] = auVar58;
          pauVar25[9] = auVar44;
          pauVar25[10] = auVar46;
          pauVar25[0xb] = auVar45;
          pauVar25 = pauVar25 + 0xc;
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
          iVar34 = iVar34 + 0x10;
        } while (iVar34 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar35 = (undefined1 (*) [32])((long)B->data + lVar26);
        iVar34 = 7;
        do {
          auVar21 = vunpcklps_avx(pauVar35[-0xb],pauVar35[-10]);
          auVar8 = vunpckhps_avx(pauVar35[-0xb],pauVar35[-10]);
          auVar22 = vunpcklps_avx(pauVar35[-9],pauVar35[-8]);
          auVar63 = vunpckhps_avx(pauVar35[-9],pauVar35[-8]);
          auVar66 = vunpcklps_avx(pauVar35[-7],pauVar35[-6]);
          auVar62 = vunpckhps_avx(pauVar35[-7],pauVar35[-6]);
          auVar68 = vunpcklps_avx(pauVar35[-5],pauVar35[-4]);
          auVar9 = vunpckhps_avx(pauVar35[-5],pauVar35[-4]);
          auVar69 = vunpcklps_avx(pauVar35[-3],pauVar35[-2]);
          auVar64 = vunpckhps_avx(pauVar35[-3],pauVar35[-2]);
          auVar42 = vunpcklps_avx(pauVar35[-1],*pauVar35);
          auVar10 = vunpckhps_avx(pauVar35[-1],*pauVar35);
          auVar16 = vunpcklpd_avx(auVar21,auVar22);
          auVar21 = vunpckhpd_avx(auVar21,auVar22);
          auVar22 = vunpcklpd_avx(auVar8,auVar63);
          auVar8 = vunpckhpd_avx(auVar8,auVar63);
          auVar65 = vunpcklpd_avx(auVar66,auVar68);
          auVar63 = vunpckhpd_avx(auVar66,auVar68);
          auVar66 = vunpcklpd_avx(auVar62,auVar9);
          auVar62 = vunpckhpd_avx(auVar62,auVar9);
          auVar68 = vunpcklpd_avx(auVar69,auVar42);
          auVar9 = vunpckhpd_avx(auVar69,auVar42);
          auVar69 = vunpcklpd_avx(auVar64,auVar10);
          auVar64 = vunpckhpd_avx(auVar64,auVar10);
          auVar67._16_16_ = auVar65._0_16_;
          auVar67._0_16_ = auVar16._0_16_;
          auVar70._16_16_ = auVar21._0_16_;
          auVar70._0_16_ = auVar68._0_16_;
          auVar71._16_16_ = auVar9._0_16_;
          auVar71._0_16_ = auVar63._0_16_;
          auVar72._16_16_ = auVar66._0_16_;
          auVar72._0_16_ = auVar22._0_16_;
          auVar42 = vinsertf32x4_avx512vl(auVar69,auVar8._0_16_,1);
          auVar43 = vinsertf32x4_avx512vl(auVar62,auVar64._0_16_,1);
          auVar10 = vperm2f128_avx(auVar16,auVar65,0x31);
          auVar21 = vperm2f128_avx(auVar68,auVar21,0x31);
          auVar63 = vperm2f128_avx(auVar63,auVar9,0x31);
          auVar9 = vperm2f128_avx(auVar22,auVar66,0x31);
          auVar8 = vperm2f128_avx(auVar69,auVar8,0x31);
          auVar62 = vperm2f128_avx(auVar62,auVar64,0x31);
          *(undefined1 (*) [32])*pauVar25 = auVar67;
          *(undefined1 (*) [32])(*pauVar25 + 0x20) = auVar70;
          *(undefined1 (*) [32])pauVar25[1] = auVar71;
          *(undefined1 (*) [32])(pauVar25[1] + 0x20) = auVar72;
          *(undefined1 (*) [32])pauVar25[2] = auVar42;
          *(undefined1 (*) [32])(pauVar25[2] + 0x20) = auVar43;
          *(undefined1 (*) [32])pauVar25[3] = auVar10;
          *(undefined1 (*) [32])(pauVar25[3] + 0x20) = auVar21;
          *(undefined1 (*) [32])pauVar25[4] = auVar63;
          *(undefined1 (*) [32])(pauVar25[4] + 0x20) = auVar9;
          *(undefined1 (*) [32])pauVar25[5] = auVar8;
          *(undefined1 (*) [32])(pauVar25[5] + 0x20) = auVar62;
          pauVar25 = pauVar25 + 6;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar2 * 8) * 4);
          iVar34 = iVar34 + 8;
        } while (iVar34 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar32);
        iVar34 = 3;
        do {
          auVar17 = vunpcklps_avx(pauVar36[-0xb],pauVar36[-10]);
          auVar18 = vunpcklps_avx(pauVar36[-9],pauVar36[-8]);
          auVar4 = vunpckhps_avx(pauVar36[-0xb],pauVar36[-10]);
          auVar5 = vunpckhps_avx(pauVar36[-9],pauVar36[-8]);
          auVar11 = vunpcklpd_avx(auVar17,auVar18);
          auVar17 = vunpckhpd_avx(auVar17,auVar18);
          auVar12 = vunpcklpd_avx(auVar4,auVar5);
          auVar4 = vunpckhpd_avx(auVar4,auVar5);
          auVar5 = vunpcklps_avx(pauVar36[-7],pauVar36[-6]);
          auVar19 = vunpcklps_avx(pauVar36[-5],pauVar36[-4]);
          auVar18 = vunpckhps_avx(pauVar36[-7],pauVar36[-6]);
          auVar6 = vunpckhps_avx(pauVar36[-5],pauVar36[-4]);
          auVar13 = vunpcklpd_avx(auVar5,auVar19);
          auVar5 = vunpckhpd_avx(auVar5,auVar19);
          auVar14 = vunpcklpd_avx(auVar18,auVar6);
          auVar18 = vunpckhpd_avx(auVar18,auVar6);
          auVar6 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
          auVar20 = vunpcklps_avx(pauVar36[-1],*pauVar36);
          auVar19 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
          auVar7 = vunpckhps_avx(pauVar36[-1],*pauVar36);
          auVar15 = vunpcklpd_avx(auVar6,auVar20);
          auVar6 = vunpckhpd_avx(auVar6,auVar20);
          auVar20 = vunpcklpd_avx(auVar19,auVar7);
          auVar19 = vunpckhpd_avx(auVar19,auVar7);
          *(undefined1 (*) [16])*pauVar25 = auVar11;
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar13;
          *(undefined1 (*) [16])(*pauVar25 + 0x20) = auVar15;
          *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar17;
          *(undefined1 (*) [16])pauVar25[1] = auVar5;
          *(undefined1 (*) [16])(pauVar25[1] + 0x10) = auVar6;
          *(undefined1 (*) [16])(pauVar25[1] + 0x20) = auVar12;
          *(undefined1 (*) [16])(pauVar25[1] + 0x30) = auVar14;
          *(undefined1 (*) [16])pauVar25[2] = auVar20;
          *(undefined1 (*) [16])(pauVar25[2] + 0x10) = auVar4;
          *(undefined1 (*) [16])(pauVar25[2] + 0x20) = auVar18;
          *(undefined1 (*) [16])(pauVar25[2] + 0x30) = auVar19;
          pauVar25 = pauVar25 + 3;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(iVar2 * 4) * 4);
          iVar34 = iVar34 + 4;
        } while (iVar34 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar28);
        iVar34 = max_kk;
        do {
          uVar23 = *(undefined8 *)(pauVar36[-2] + 8);
          *(undefined8 *)*pauVar25 = *(undefined8 *)pauVar36[-2];
          *(undefined8 *)(*pauVar25 + 8) = uVar23;
          uVar23 = *(undefined8 *)(pauVar36[-1] + 8);
          *(undefined8 *)(*pauVar25 + 0x10) = *(undefined8 *)pauVar36[-1];
          *(undefined8 *)(*pauVar25 + 0x18) = uVar23;
          *(undefined1 (*) [16])(*pauVar25 + 0x20) = *pauVar36;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x30);
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + lVar30 * 4);
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      lVar27 = lVar33 + 0xc;
      uVar40 = lVar33 + 0x17;
      lVar31 = lVar31 + 0x300;
      lVar26 = lVar26 + 0x180;
      lVar32 = lVar32 + 0xc0;
      lVar28 = lVar28 + 0x30;
      lVar33 = lVar27;
    } while (uVar40 < (uint)max_jj);
  }
  lVar33 = (long)max_jj;
  if ((int)lVar27 + 7 < max_jj) {
    lVar31 = (long)(iVar2 * k);
    lVar26 = (long)(int)lVar27;
    lVar27 = lVar26 + lVar39;
    lVar37 = lVar27 * 0x40 + lVar31 * 4 + 0x1c0;
    lVar32 = lVar27 * 0x20 + lVar31 * 4 + 0xe0;
    lVar28 = lVar27 * 0x10 + lVar31 * 4 + 0x70;
    lVar31 = lVar39 * 4 + lVar26 * 4 + lVar31 * 4 + 0x10;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar29 = (undefined1 (*) [64])((long)B->data + lVar37);
        iVar34 = 0xf;
        do {
          auVar44 = vunpcklps_avx512f(pauVar29[-7],pauVar29[-6]);
          auVar45 = vunpckhps_avx512f(pauVar29[-7],pauVar29[-6]);
          auVar46 = vunpcklps_avx512f(pauVar29[-5],pauVar29[-4]);
          auVar47 = vunpckhps_avx512f(pauVar29[-5],pauVar29[-4]);
          auVar48 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar49 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar50 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
          auVar51 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
          auVar52 = vunpcklpd_avx512f(auVar44,auVar46);
          auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
          auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
          auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
          auVar47 = vunpcklpd_avx512f(auVar48,auVar50);
          auVar48 = vunpckhpd_avx512f(auVar48,auVar50);
          auVar50 = vunpcklpd_avx512f(auVar49,auVar51);
          auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
          auVar51 = vshuff64x2_avx512f(auVar52,auVar47,0x88);
          auVar53 = vshuff64x2_avx512f(auVar44,auVar48,0x88);
          auVar54 = vshuff64x2_avx512f(auVar46,auVar50,0x88);
          auVar55 = vshuff64x2_avx512f(auVar45,auVar49,0x88);
          auVar47 = vshuff64x2_avx512f(auVar52,auVar47,0xdd);
          auVar44 = vshuff64x2_avx512f(auVar44,auVar48,0xdd);
          auVar46 = vshuff64x2_avx512f(auVar46,auVar50,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar45,auVar49,0xdd);
          auVar48 = vshuff64x2_avx512f(auVar51,auVar53,0x88);
          auVar49 = vshuff64x2_avx512f(auVar54,auVar55,0x88);
          auVar50 = vshuff64x2_avx512f(auVar47,auVar44,0x88);
          auVar52 = vshuff64x2_avx512f(auVar46,auVar45,0x88);
          auVar51 = vshuff64x2_avx512f(auVar51,auVar53,0xdd);
          auVar53 = vshuff64x2_avx512f(auVar54,auVar55,0xdd);
          auVar44 = vshuff64x2_avx512f(auVar47,auVar44,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar46,auVar45,0xdd);
          *pauVar25 = auVar48;
          pauVar25[1] = auVar49;
          pauVar25[2] = auVar50;
          pauVar25[3] = auVar52;
          pauVar25[4] = auVar51;
          pauVar25[5] = auVar53;
          pauVar25[6] = auVar44;
          pauVar25[7] = auVar45;
          pauVar25 = pauVar25 + 8;
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
          iVar34 = iVar34 + 0x10;
        } while (iVar34 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar35 = (undefined1 (*) [32])((long)B->data + lVar32);
        iVar34 = 7;
        do {
          auVar21 = vunpcklps_avx(pauVar35[-7],pauVar35[-6]);
          auVar8 = vunpckhps_avx(pauVar35[-7],pauVar35[-6]);
          auVar10 = vunpcklps_avx(pauVar35[-5],pauVar35[-4]);
          auVar63 = vunpckhps_avx(pauVar35[-5],pauVar35[-4]);
          auVar22 = vunpcklps_avx(pauVar35[-3],pauVar35[-2]);
          auVar62 = vunpckhps_avx(pauVar35[-3],pauVar35[-2]);
          auVar65 = vunpcklps_avx(pauVar35[-1],*pauVar35);
          auVar9 = vunpckhps_avx(pauVar35[-1],*pauVar35);
          auVar64 = vunpcklpd_avx(auVar21,auVar10);
          auVar21 = vunpckhpd_avx(auVar21,auVar10);
          auVar10 = vunpcklpd_avx(auVar8,auVar63);
          auVar8 = vunpckhpd_avx(auVar8,auVar63);
          auVar16 = vunpcklpd_avx(auVar22,auVar65);
          auVar63 = vunpckhpd_avx(auVar22,auVar65);
          auVar22 = vunpcklpd_avx(auVar62,auVar9);
          auVar62 = vunpckhpd_avx(auVar62,auVar9);
          auVar65._16_16_ = auVar16._0_16_;
          auVar65._0_16_ = auVar64._0_16_;
          auVar66._16_16_ = auVar63._0_16_;
          auVar66._0_16_ = auVar21._0_16_;
          auVar68._16_16_ = auVar22._0_16_;
          auVar68._0_16_ = auVar10._0_16_;
          auVar69._16_16_ = auVar62._0_16_;
          auVar69._0_16_ = auVar8._0_16_;
          auVar9 = vperm2f128_avx(auVar64,auVar16,0x31);
          auVar21 = vperm2f128_avx(auVar21,auVar63,0x31);
          auVar63 = vperm2f128_avx(auVar10,auVar22,0x31);
          auVar8 = vperm2f128_avx(auVar8,auVar62,0x31);
          *(undefined1 (*) [32])*pauVar25 = auVar65;
          *(undefined1 (*) [32])(*pauVar25 + 0x20) = auVar66;
          *(undefined1 (*) [32])pauVar25[1] = auVar68;
          *(undefined1 (*) [32])(pauVar25[1] + 0x20) = auVar69;
          *(undefined1 (*) [32])pauVar25[2] = auVar9;
          *(undefined1 (*) [32])(pauVar25[2] + 0x20) = auVar21;
          *(undefined1 (*) [32])pauVar25[3] = auVar63;
          *(undefined1 (*) [32])(pauVar25[3] + 0x20) = auVar8;
          pauVar25 = pauVar25 + 4;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar2 * 8) * 4);
          iVar34 = iVar34 + 8;
        } while (iVar34 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar28);
        iVar34 = 3;
        do {
          auVar17 = vunpcklps_avx(pauVar36[-7],pauVar36[-6]);
          auVar18 = vunpcklps_avx(pauVar36[-5],pauVar36[-4]);
          auVar4 = vunpckhps_avx(pauVar36[-7],pauVar36[-6]);
          auVar5 = vunpckhps_avx(pauVar36[-5],pauVar36[-4]);
          auVar19 = vunpcklpd_avx(auVar17,auVar18);
          auVar17 = vunpckhpd_avx(auVar17,auVar18);
          auVar7 = vunpcklpd_avx(auVar4,auVar5);
          auVar4 = vunpckhpd_avx(auVar4,auVar5);
          auVar5 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
          auVar12 = vunpcklps_avx(pauVar36[-1],*pauVar36);
          auVar18 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
          auVar6 = vunpckhps_avx(pauVar36[-1],*pauVar36);
          auVar11 = vunpcklpd_avx(auVar5,auVar12);
          auVar5 = vunpckhpd_avx(auVar5,auVar12);
          auVar12 = vunpcklpd_avx(auVar18,auVar6);
          auVar18 = vunpckhpd_avx(auVar18,auVar6);
          *(undefined1 (*) [16])*pauVar25 = auVar19;
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar11;
          *(undefined1 (*) [16])(*pauVar25 + 0x20) = auVar17;
          *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar5;
          *(undefined1 (*) [16])pauVar25[1] = auVar7;
          *(undefined1 (*) [16])(pauVar25[1] + 0x10) = auVar12;
          *(undefined1 (*) [16])(pauVar25[1] + 0x20) = auVar4;
          *(undefined1 (*) [16])(pauVar25[1] + 0x30) = auVar18;
          pauVar25 = pauVar25 + 2;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(iVar2 * 4) * 4);
          iVar34 = iVar34 + 4;
        } while (iVar34 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar31);
        iVar34 = max_kk;
        do {
          uVar23 = *(undefined8 *)(pauVar36[-1] + 8);
          *(undefined8 *)*pauVar25 = *(undefined8 *)pauVar36[-1];
          *(undefined8 *)(*pauVar25 + 8) = uVar23;
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = *pauVar36;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + lVar30 * 4);
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      lVar27 = lVar26 + 8;
      lVar37 = lVar37 + 0x200;
      lVar32 = lVar32 + 0x100;
      lVar28 = lVar28 + 0x80;
      lVar31 = lVar31 + 0x20;
      bVar3 = lVar26 < lVar33 + -0xf;
      lVar26 = lVar27;
    } while (bVar3);
  }
  if ((int)((uint)lVar27 | 3) < max_jj) {
    lVar26 = (long)(iVar2 * k);
    lVar28 = (long)(int)(uint)lVar27;
    lVar27 = lVar28 + lVar39;
    lVar32 = lVar27 * 0x40 + lVar26 * 4 + 0xc0;
    lVar37 = lVar27 * 0x20 + lVar26 * 4 + 0x60;
    lVar31 = lVar27 * 0x10 + lVar26 * 4 + 0x30;
    lVar26 = lVar39 * 4 + lVar28 * 4 + lVar26 * 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar29 = (undefined1 (*) [64])((long)B->data + lVar32);
        iVar34 = 0xf;
        do {
          auVar44 = vunpcklps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar45 = vunpckhps_avx512f(pauVar29[-3],pauVar29[-2]);
          auVar46 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
          auVar47 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
          auVar48 = vunpcklpd_avx512f(auVar44,auVar46);
          auVar44 = vunpckhpd_avx512f(auVar44,auVar46);
          auVar46 = vunpcklpd_avx512f(auVar45,auVar47);
          auVar45 = vunpckhpd_avx512f(auVar45,auVar47);
          auVar47 = vshuff64x2_avx512f(auVar48,auVar44,0x88);
          auVar49 = vshuff64x2_avx512f(auVar46,auVar45,0x88);
          auVar44 = vshuff64x2_avx512f(auVar48,auVar44,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar46,auVar45,0xdd);
          auVar46 = vshuff64x2_avx512f(auVar47,auVar49,0x88);
          auVar48 = vshuff64x2_avx512f(auVar44,auVar45,0x88);
          auVar47 = vshuff64x2_avx512f(auVar47,auVar49,0xdd);
          auVar44 = vshuff64x2_avx512f(auVar44,auVar45,0xdd);
          *pauVar25 = auVar46;
          pauVar25[1] = auVar48;
          pauVar25[2] = auVar47;
          pauVar25[3] = auVar44;
          pauVar25 = pauVar25 + 4;
          iVar34 = iVar34 + 0x10;
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar35 = (undefined1 (*) [32])((long)B->data + lVar37);
        iVar34 = 7;
        do {
          auVar21 = vunpcklps_avx(pauVar35[-3],pauVar35[-2]);
          auVar8 = vunpckhps_avx(pauVar35[-3],pauVar35[-2]);
          auVar9 = vunpcklps_avx(pauVar35[-1],*pauVar35);
          auVar63 = vunpckhps_avx(pauVar35[-1],*pauVar35);
          auVar62 = vunpcklpd_avx(auVar21,auVar9);
          auVar21 = vunpckhpd_avx(auVar21,auVar9);
          auVar9 = vunpcklpd_avx(auVar8,auVar63);
          auVar8 = vunpckhpd_avx(auVar8,auVar63);
          auVar63._16_16_ = auVar21._0_16_;
          auVar63._0_16_ = auVar62._0_16_;
          auVar64._16_16_ = auVar8._0_16_;
          auVar64._0_16_ = auVar9._0_16_;
          auVar21 = vperm2f128_avx(auVar62,auVar21,0x31);
          auVar8 = vperm2f128_avx(auVar9,auVar8,0x31);
          *(undefined1 (*) [32])*pauVar25 = auVar63;
          *(undefined1 (*) [32])(*pauVar25 + 0x20) = auVar64;
          *(undefined1 (*) [32])pauVar25[1] = auVar21;
          *(undefined1 (*) [32])(pauVar25[1] + 0x20) = auVar8;
          pauVar25 = pauVar25 + 2;
          iVar34 = iVar34 + 8;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar2 * 8) * 4);
        } while (iVar34 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar31);
        iVar34 = 3;
        do {
          auVar17 = vunpcklps_avx(pauVar36[-3],pauVar36[-2]);
          auVar6 = vunpcklps_avx(pauVar36[-1],*pauVar36);
          auVar4 = vunpckhps_avx(pauVar36[-3],pauVar36[-2]);
          auVar5 = vunpckhps_avx(pauVar36[-1],*pauVar36);
          auVar18 = vunpcklpd_avx(auVar17,auVar6);
          auVar17 = vunpckhpd_avx(auVar17,auVar6);
          auVar6 = vunpcklpd_avx(auVar4,auVar5);
          auVar4 = vunpckhpd_avx(auVar4,auVar5);
          *(undefined1 (*) [16])*pauVar25 = auVar18;
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar17;
          *(undefined1 (*) [16])(*pauVar25 + 0x20) = auVar6;
          *(undefined1 (*) [16])(*pauVar25 + 0x30) = auVar4;
          pauVar25 = pauVar25 + 1;
          iVar34 = iVar34 + 4;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(iVar2 * 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar26);
        iVar34 = max_kk;
        do {
          *(undefined1 (*) [16])*pauVar25 = *pauVar36;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + lVar30 * 4);
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      lVar27 = lVar28 + 4;
      lVar41 = lVar28 + 7;
      lVar32 = lVar32 + 0x100;
      lVar37 = lVar37 + 0x80;
      lVar31 = lVar31 + 0x40;
      lVar26 = lVar26 + 0x10;
      lVar28 = lVar27;
    } while (lVar41 < lVar33);
  }
  if ((int)((uint)lVar27 | 1) < max_jj) {
    lVar28 = (long)(iVar2 * k);
    lVar26 = (long)(int)(uint)lVar27;
    lVar27 = lVar26 + lVar39;
    lVar32 = lVar27 * 0x40 + lVar28 * 4 + 0x40;
    lVar37 = lVar27 * 0x20 + lVar28 * 4 + 0x20;
    lVar31 = lVar27 * 0x10 + lVar28 * 4 + 0x10;
    lVar28 = lVar39 * 4 + lVar26 * 4 + lVar28 * 4 + 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar29 = (undefined1 (*) [64])((long)B->data + lVar32);
        iVar34 = 0xf;
        do {
          auVar44 = vunpcklps_avx512f(pauVar29[-1],*pauVar29);
          auVar45 = vunpckhps_avx512f(pauVar29[-1],*pauVar29);
          auVar46 = vshuff64x2_avx512f(auVar44,auVar45,0x88);
          auVar44 = vshuff64x2_avx512f(auVar44,auVar45,0xdd);
          auVar45 = vshuff64x2_avx512f(auVar46,auVar44,0x88);
          auVar44 = vshuff64x2_avx512f(auVar46,auVar44,0xdd);
          *pauVar25 = auVar45;
          pauVar25[1] = auVar44;
          pauVar25 = pauVar25 + 2;
          iVar34 = iVar34 + 0x10;
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar35 = (undefined1 (*) [32])((long)B->data + lVar37);
        iVar34 = 7;
        do {
          auVar8 = vunpcklps_avx(pauVar35[-1],*pauVar35);
          auVar21 = vunpckhps_avx(pauVar35[-1],*pauVar35);
          auVar62._16_16_ = auVar21._0_16_;
          auVar62._0_16_ = auVar8._0_16_;
          auVar21 = vperm2f128_avx(auVar8,auVar21,0x31);
          *(undefined1 (*) [32])*pauVar25 = auVar62;
          *(undefined1 (*) [32])(*pauVar25 + 0x20) = auVar21;
          pauVar25 = pauVar25 + 1;
          iVar34 = iVar34 + 8;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar2 * 8) * 4);
        } while (iVar34 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar31);
        iVar34 = 3;
        do {
          auVar4 = vunpcklps_avx(pauVar36[-1],*pauVar36);
          auVar17 = vunpckhps_avx(pauVar36[-1],*pauVar36);
          *(undefined1 (*) [16])*pauVar25 = auVar4;
          *(undefined1 (*) [16])(*pauVar25 + 0x10) = auVar17;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar34 = iVar34 + 4;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(iVar2 * 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar38 = (undefined4 *)((long)B->data + lVar28);
        iVar34 = max_kk;
        do {
          *(undefined4 *)*pauVar25 = puVar38[-1];
          *(undefined4 *)(*pauVar25 + 4) = *puVar38;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 8);
          puVar38 = puVar38 + lVar30;
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      lVar27 = lVar26 + 2;
      lVar41 = lVar26 + 3;
      lVar32 = lVar32 + 0x80;
      lVar37 = lVar37 + 0x40;
      lVar31 = lVar31 + 0x20;
      lVar28 = lVar28 + 8;
      lVar26 = lVar27;
    } while (lVar41 < lVar33);
  }
  if ((int)lVar27 < max_jj) {
    lVar31 = (long)(k * iVar2);
    lVar32 = (long)(int)lVar27;
    lVar27 = lVar32 + lVar39;
    lVar26 = lVar27 * 0x40 + lVar31 * 4;
    lVar28 = lVar27 * 0x20 + lVar31 * 4;
    lVar27 = lVar27 * 0x10 + lVar31 * 4;
    lVar39 = lVar39 * 4 + lVar32 * 4 + lVar31 * 4;
    do {
      if (0xf < max_kk && iVar1 == 0x10) {
        pauVar29 = (undefined1 (*) [64])((long)B->data + lVar26);
        iVar34 = 0xf;
        do {
          *pauVar25 = *pauVar29;
          pauVar25 = pauVar25 + 1;
          iVar34 = iVar34 + 0x10;
          pauVar29 = (undefined1 (*) [64])(*pauVar29 + (long)(iVar2 << 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (7 < max_kk && iVar1 == 8) {
        pauVar35 = (undefined1 (*) [32])((long)B->data + lVar28);
        iVar34 = 7;
        do {
          *(undefined1 (*) [32])*pauVar25 = *pauVar35;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar34 = iVar34 + 8;
          pauVar35 = (undefined1 (*) [32])(*pauVar35 + (long)(iVar2 * 8) * 4);
        } while (iVar34 < max_kk);
      }
      if (3 < max_kk && iVar1 == 4) {
        pauVar36 = (undefined1 (*) [16])((long)B->data + lVar27);
        iVar34 = 3;
        do {
          *(undefined1 (*) [16])*pauVar25 = *pauVar36;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          iVar34 = iVar34 + 4;
          pauVar36 = (undefined1 (*) [16])(*pauVar36 + (long)(iVar2 * 4) * 4);
        } while (iVar34 < max_kk);
      }
      if (0 < max_kk && iVar1 == 1) {
        puVar38 = (undefined4 *)((long)B->data + lVar39);
        iVar34 = max_kk;
        do {
          *(undefined4 *)*pauVar25 = *puVar38;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
          puVar38 = puVar38 + lVar30;
          iVar34 = iVar34 + -1;
        } while (iVar34 != 0);
      }
      lVar32 = lVar32 + 1;
      lVar26 = lVar26 + 0x40;
      lVar28 = lVar28 + 0x20;
      lVar27 = lVar27 + 0x10;
      lVar39 = lVar39 + 4;
    } while (lVar32 != lVar33);
  }
  return;
}

Assistant:

static void transpose_pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                transpose16x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                pp += 192;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                _mm256_store_ps(pp + 8 * 8, _r8);
                _mm256_store_ps(pp + 8 * 9, _r9);
                _mm256_store_ps(pp + 8 * 10, _ra);
                _mm256_store_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                _mm_store_ps(pp + 8, _mm_loadu_ps(p0 + 8));
                pp += 12;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                _mm_store_ps(pp + 4, _mm_loadu_ps(p0 + 4));
                pp += 8;
                p0 += B_hstep;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += B_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += B_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += B_hstep;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += B_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += B_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += B_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + k * B_hstep + (j + jj);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += B_hstep;
            }
        }
    }
}